

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.h
# Opt level: O3

void __thiscall TPZEquationFilter::Filter(TPZEquationFilter *this,TPZVec<long> *dest)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((this->fDestIndices).fNElements == 0) {
    return;
  }
  lVar1 = dest->fNElements;
  if (lVar1 < 1) {
    lVar5 = 0;
  }
  else {
    plVar2 = dest->fStore;
    plVar3 = (this->fDestIndices).fStore;
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar4 = plVar3[plVar2[lVar6]];
      if (lVar4 != -1) {
        plVar2[lVar5] = lVar4;
        lVar5 = lVar5 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar1 != lVar6);
  }
  (*dest->_vptr_TPZVec[3])(dest,lVar5);
  return;
}

Assistant:

void Filter(TPZVec<int64_t> &dest) const
    {
        if (fDestIndices.size() == 0) {
            return;
        }
        else{
            int64_t count = 0;
            int64_t numeq = dest.size();
            for (int64_t i=0; i<numeq; i++) {
                if (fDestIndices[dest[i]] != -1) {
                    dest[count] = fDestIndices[dest[i]];
                    count++;
                }
            }
            dest.Resize(count);
        }
    }